

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionShape.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionShapePolyline::UpdateProfile(ChBeamSectionShapePolyline *this)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  std::
  vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
  ::resize((vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
            *)(this + 0x20),
           (*(long *)(this + 0x10) - *(long *)(this + 8) >> 3) * -0x5555555555555555);
  lVar5 = *(long *)(this + 8);
  if (*(long *)(this + 0x10) != lVar5) {
    lVar8 = *(long *)(this + 0x20);
    uVar11 = 0;
    do {
      lVar6 = uVar11 * 0x18;
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
                ((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
                 (lVar8 + lVar6),
                 (*(long *)(lVar5 + 8 + lVar6) - *(long *)(lVar5 + lVar6) >> 3) *
                 -0x5555555555555555);
      lVar5 = *(long *)(this + 8);
      lVar8 = *(long *)(this + 0x20);
      lVar1 = *(long *)(lVar5 + lVar6);
      lVar2 = *(long *)(lVar8 + lVar6);
      lVar6 = *(long *)(lVar5 + 8 + lVar6) - lVar1;
      lVar9 = (lVar6 >> 3) * -0x5555555555555555;
      if (1 < lVar9 - 1U) {
        lVar9 = lVar9 + -2;
        lVar10 = 0;
        do {
          dVar3 = *(double *)(lVar1 + 0x40 + lVar10) - *(double *)(lVar1 + 0x10 + lVar10);
          dVar4 = *(double *)(lVar1 + 0x38 + lVar10) - *(double *)(lVar1 + 8 + lVar10);
          auVar18._0_8_ = -dVar3;
          auVar18._8_8_ = 0x8000000000000000;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = dVar4;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar3 * dVar3;
          auVar12 = vfmadd231sd_fma(auVar24,auVar12,auVar12);
          auVar12 = vsqrtsd_avx(auVar12,auVar12);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar4;
          auVar13 = vunpcklpd_avx(auVar18,auVar13);
          auVar19._8_8_ = auVar12._0_8_;
          auVar19._0_8_ = auVar12._0_8_;
          auVar12 = vdivpd_avx(auVar13,auVar19);
          *(undefined1 (*) [16])(lVar2 + 0x20 + lVar10) = auVar12;
          lVar10 = lVar10 + 0x18;
          lVar9 = lVar9 + -1;
        } while (lVar9 != 0);
      }
      uVar11 = uVar11 + 1;
      dVar3 = *(double *)(lVar1 + 0x28) - *(double *)(lVar1 + 0x10);
      dVar4 = *(double *)(lVar1 + 0x20) - *(double *)(lVar1 + 8);
      auVar20._0_8_ = -dVar3;
      auVar20._8_8_ = 0x8000000000000000;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar4;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar3 * dVar3;
      auVar12 = vfmadd231sd_fma(auVar25,auVar14,auVar14);
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar4;
      auVar13 = vunpcklpd_avx(auVar20,auVar15);
      auVar21._8_8_ = auVar12._0_8_;
      auVar21._0_8_ = auVar12._0_8_;
      auVar12 = vdivpd_avx(auVar13,auVar21);
      *(undefined1 (*) [16])(lVar2 + 8) = auVar12;
      dVar3 = *(double *)(lVar1 + -8 + lVar6) - *(double *)(lVar1 + -0x20 + lVar6);
      dVar4 = *(double *)(lVar1 + -0x10 + lVar6) - *(double *)(lVar1 + -0x28 + lVar6);
      auVar22._0_8_ = -dVar3;
      auVar22._8_8_ = 0x8000000000000000;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar4;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar3 * dVar3;
      auVar12 = vfmadd231sd_fma(auVar26,auVar16,auVar16);
      auVar12 = vsqrtsd_avx(auVar12,auVar12);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar4;
      auVar13 = vunpcklpd_avx(auVar22,auVar17);
      auVar23._8_8_ = auVar12._0_8_;
      auVar23._0_8_ = auVar12._0_8_;
      auVar12 = vdivpd_avx(auVar13,auVar23);
      *(undefined1 (*) [16])(lVar2 + -0x10 + lVar6) = auVar12;
      uVar7 = (*(long *)(this + 0x10) - lVar5 >> 3) * -0x5555555555555555;
    } while (uVar11 <= uVar7 && uVar7 - uVar11 != 0);
  }
  return;
}

Assistant:

void ChBeamSectionShapePolyline::UpdateProfile() {
    ml_normals.resize(ml_points.size());

    for (int il = 0; il < ml_points.size(); ++il) {
        ml_normals[il].resize(ml_points[il].size());
        double dy, dz, len;
        for (int ip = 1; ip < ml_points[il].size() - 1; ++ip) {
            dy = ml_points[il][ip + 1].y() - ml_points[il][ip - 1].y();
            dz = ml_points[il][ip + 1].z() - ml_points[il][ip - 1].z();
            len = sqrt(dy * dy + dz * dz);
            ml_normals[il][ip].y() = -dz / len;
            ml_normals[il][ip].z() = dy / len;
        }
        dy = ml_points[il][1].y() - ml_points[il][0].y();
        dz = ml_points[il][1].z() - ml_points[il][0].z();
        len = sqrt(dy * dy + dz * dz);
        ml_normals[il][0].y() = -dz / len;
        ml_normals[il][0].z() = dy / len;
        dy = ml_points[il][ml_points[il].size() - 1].y() - ml_points[il][ml_points[il].size() - 2].y();
        dz = ml_points[il][ml_points[il].size() - 1].z() - ml_points[il][ml_points[il].size() - 2].z();
        len = sqrt(dy * dy + dz * dz);
        ml_normals[il][ml_points[il].size() - 1].y() = -dz / len;
        ml_normals[il][ml_points[il].size() - 1].z() = dy / len;
    }
}